

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<_1ba91462_> * __thiscall
llvm::SmallVectorImpl<$1ba91462$>::operator=
          (SmallVectorImpl<_1ba91462_> *this,SmallVectorImpl<_1ba91462_> *RHS)

{
  bool bVar1;
  iterator MinSize;
  iterator pUVar2;
  Unparsed *local_f0;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<_1ba91462_> *RHS_local;
  SmallVectorImpl<_1ba91462_> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<$82bc3fea$>::isSmall
                      ((SmallVectorTemplateCommon<_82bc3fea_> *)RHS);
    if (bVar1) {
      MinSize = (iterator)
                (((long)(RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                        super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX -
                 (long)(RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                       super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX) /
                0x18);
      NewEnd = (iterator)
               (((long)(this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                       super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX -
                (long)(this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                      super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX) /
               0x18);
      if (NewEnd < MinSize) {
        pUVar2 = (iterator)
                 SmallVectorTemplateCommon<$82bc3fea$>::capacity
                           ((SmallVectorTemplateCommon<_82bc3fea_> *)this);
        if (pUVar2 < MinSize) {
          SmallVectorTemplateBase<$d3e3f58d$>::destroy_range
                    ((Unparsed *)
                     (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                     super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX,
                     (Unparsed *)
                     (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                     super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX);
          SmallVectorTemplateCommon<$82bc3fea$>::setEnd
                    ((SmallVectorTemplateCommon<_82bc3fea_> *)this,
                     (Unparsed *)
                     (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                     super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<$d3e3f58d$>::grow
                    (&this->super_SmallVectorTemplateBase<_d3e3f58d_>,(size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          std::
          move<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::String>,Fixpp::TagT<594u,Fixpp::Type::String>,Fixpp::TagT<247u,Fixpp::Type___nt<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>__Unparsed_>
                    ((Unparsed *)
                     (RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                     super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX,
                     (Unparsed *)
                     ((long)(RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                            super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX
                     + (long)NewEnd * 0x18),
                     (Unparsed *)
                     (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                     super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX);
        }
        SmallVectorTemplateBase<$d3e3f58d$>::uninitialized_move<_5ca38e48_>
                  ((Unparsed *)
                   ((long)(RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                          super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX +
                   (long)NewEnd * 0x18),
                   (Unparsed *)
                   (RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                   super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX,
                   (Unparsed *)
                   ((long)(this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                          super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX +
                   (long)NewEnd * 0x18));
        SmallVectorTemplateCommon<$82bc3fea$>::setEnd
                  ((SmallVectorTemplateCommon<_82bc3fea_> *)this,
                   (Unparsed *)
                   ((long)(this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                          super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX +
                   (long)MinSize * 0x18));
        clear(RHS);
      }
      else {
        local_f0 = (Unparsed *)
                   (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                   super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX;
        if (MinSize != (iterator)0x0) {
          local_f0 = std::
                     move<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::ComponentBlock<Fixpp::TagT<311u,Fixpp::Type::String>,Fixpp::TagT<312u,Fixpp::Type::String>,Fixpp::TagT<309u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>,Fixpp::TagT<462u,Fixpp::Type::Int>,Fixpp::TagT<463u,Fixpp::Type::String>,Fixpp::TagT<310u,Fixpp::Type::String>,Fixpp::TagT<763u,Fixpp::Type::String>,Fixpp::TagT<313u,Fixpp::Type::String>,Fixpp::TagT<542u,Fixpp::Type::String>,Fixpp::TagT<241u,Fixpp::Type::String>,Fixpp::TagT<242u,Fixpp::Type::String>,Fixpp::TagT<243u,Fixpp::Type::Int>,Fixpp::TagT<244u,Fixpp::Type::Int>,Fixpp::TagT<245u,Fixpp::Type::Float>,Fixpp::TagT<246u,Fixpp::Type::Float>,Fixpp::TagT<256u,Fixpp::Type::String>,Fixpp::TagT<595u,Fixpp::Type::String>,Fixpp::TagT<592u,Fixpp::Type::String>,Fixpp::TagT<593u,Fixpp::Type::String>,Fixpp::TagT<594u,Fixpp::Type::String>,Fixpp::TagT<247u,Fixpp::Type___nt<10ul>,Fixpp::TagT<888u,Fixpp::Type::String>,Fixpp::TagT<889u,Fixpp::Type::String>>>>>__Unparsed_>
                               ((Unparsed *)
                                (RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                                super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.
                                BeginX,(Unparsed *)
                                       (RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
                                       super_SmallVectorTemplateCommon<_82bc3fea_>.
                                       super_SmallVectorBase.EndX,local_f0);
        }
        SmallVectorTemplateBase<$d3e3f58d$>::destroy_range
                  (local_f0,(Unparsed *)
                            (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                            super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX);
        SmallVectorTemplateCommon<$82bc3fea$>::setEnd
                  ((SmallVectorTemplateCommon<_82bc3fea_> *)this,local_f0);
        clear(RHS);
      }
    }
    else {
      SmallVectorTemplateBase<$d3e3f58d$>::destroy_range
                ((Unparsed *)
                 (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                 super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX,
                 (Unparsed *)
                 (this->super_SmallVectorTemplateBase<_d3e3f58d_>).
                 super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX);
      bVar1 = SmallVectorTemplateCommon<$82bc3fea$>::isSmall
                        ((SmallVectorTemplateCommon<_82bc3fea_> *)this);
      if (!bVar1) {
        free((this->super_SmallVectorTemplateBase<_d3e3f58d_>).
             super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX);
      }
      (this->super_SmallVectorTemplateBase<_d3e3f58d_>).super_SmallVectorTemplateCommon<_82bc3fea_>.
      super_SmallVectorBase.BeginX =
           (RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
           super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.BeginX;
      (this->super_SmallVectorTemplateBase<_d3e3f58d_>).super_SmallVectorTemplateCommon<_82bc3fea_>.
      super_SmallVectorBase.EndX =
           (RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
           super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.EndX;
      (this->super_SmallVectorTemplateBase<_d3e3f58d_>).super_SmallVectorTemplateCommon<_82bc3fea_>.
      super_SmallVectorBase.CapacityX =
           (RHS->super_SmallVectorTemplateBase<_d3e3f58d_>).
           super_SmallVectorTemplateCommon<_82bc3fea_>.super_SmallVectorBase.CapacityX;
      SmallVectorTemplateCommon<$82bc3fea$>::resetToSmall
                ((SmallVectorTemplateCommon<_82bc3fea_> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->EndX = RHS.EndX;
    this->CapacityX = RHS.CapacityX;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->setEnd(NewEnd);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);

  RHS.clear();
  return *this;
}